

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

CMbuffer cm_buffer_dump_list(CManager_conflict cm)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CMbuffer p_Var2;
  
  iVar1 = puts("Known CM buffers are:");
  p_Var2 = (CMbuffer)CONCAT44(extraout_var,iVar1);
  if (cm != (CManager_conflict)0x0) {
    do {
      iVar1 = printf("Buffer begin %p, size %zd, end %p\n",cm->transports,*(long *)&cm->initialized,
                     (long)cm->transports + *(long *)&cm->initialized);
      p_Var2 = (CMbuffer)CONCAT44(extraout_var_00,iVar1);
      cm = *(CManager_conflict *)&cm->CManager_ID;
    } while (cm != (CManager_conflict)0x0);
  }
  return p_Var2;
}

Assistant:

static CMbuffer
 cm_buffer_dump_list(CManager cm)
 {
     CMbuffer tmp = cm->cm_buffer_list;
     printf("Known CM buffers are:\n");
     while (tmp != NULL) {
	 printf("Buffer begin %p, size %zd, end %p\n",
		tmp->buffer, tmp->size, (char*)tmp->buffer + tmp->size);
	 tmp = tmp->next;
     }
     return NULL;
 }